

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
::grow(SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
       *this,size_t MinSize)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  size_t sVar4;
  Unparsed *Dest;
  Unparsed *NewElts;
  size_t NewCapacity;
  size_t CurSize;
  size_t CurCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_false>
  *this_local;
  
  sVar4 = SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
          ::capacity(&this->
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
                    );
  pvVar1 = (this->
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
           ).super_SmallVectorBase.EndX;
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
           ).super_SmallVectorBase.BeginX;
  NewElts = (Unparsed *)NextPowerOf2(sVar4 + 2);
  if (NewElts < MinSize) {
    NewElts = (Unparsed *)MinSize;
  }
  Dest = (Unparsed *)malloc((long)NewElts * 0x18);
  SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<79u,Fixpp::Type::String>,Fixpp::TagT<366u,Fixpp::Type::Float>,Fixpp::Required<Fixpp::TagT<80u,Fixpp::Type::Float>>,Fixpp::TagT<81u,Fixpp::Type::Char>,Fixpp::TagT<92u,Fixpp::Type::String>,Fixpp::TagT<208u,Fixpp::Type::Boolean>,Fixpp::TagT<209u,Fixpp::Type::Int>,Fixpp::TagT<161u,Fixpp::Type::String>,Fixpp::TagT<360u,Fixpp::Type::Int>,Fixpp::TagT<361u,Fixpp::Type::Data>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<12u,Fixpp::Type::Float>,Fixpp::TagT<13u,Fixpp::Type::Char>,Fixpp::TagT<153u,Fixpp::Type::Float>,Fixpp::TagT<154u,Fixpp::Type::Float>,Fixpp::TagT<119u,Fixpp::Type::Float>,Fixpp::TagT<120u,Fixpp::Type::String>,Fixpp::TagT<155u,Fixpp::Type::Float>,Fixpp::TagT<156u,Fixpp::Type::Char>,Fixpp::TagT<159u,Fixpp::Type::Float>,Fixpp::TagT<160u,Fixpp::Type::Char>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<136u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<137u,Fixpp::Type::Float>,Fixpp::TagT<138u,Fixpp::Type::String>,Fixpp::TagT<139u,Fixpp::Type::Char>>>::Unparsed,false>
  ::
  uninitialized_move<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::TagT<79u,Fixpp::Type::String>,Fixpp::TagT<366u,Fixpp::Type::Float>,Fixpp::Required<Fixpp::TagT<80u,Fixpp::Type::Float>>,Fixpp::TagT<81u,Fixpp::Type::Char>,Fixpp::TagT<92u,Fixpp::Type::String>,Fixpp::TagT<208u,Fixpp::Type::Boolean>,Fixpp::TagT<209u,Fixpp::Type::Int>,Fixpp::TagT<161u,Fixpp::Type::String>,Fixpp::TagT<360u,Fixpp::Type::Int>,Fixpp::TagT<361u,Fixpp::Type::Data>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<12u,Fixpp::Type::Float>,Fixpp::TagT<13u,Fixpp::Type::Char>,Fixpp::TagT<153u,Fixpp::Type::Float>,Fixpp::TagT<154u,Fixpp::Type::Float>,Fixpp::TagT<119u,Fixpp::Type::Float>,Fixpp::TagT<120u,Fixpp::Type::String>,Fixpp::TagT<155u,Fixpp::Type::Float>,Fixpp::TagT<156u,Fixpp::Type::Char>,Fixpp::TagT<159u,Fixpp::Type::Float>,Fixpp::TagT<160u,Fixpp::Type::Char>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<136u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<137u,Fixpp::Type::Float>,Fi___Type::Float>,Fixpp::TagT<138u,Fixpp::Type::String>,Fixpp::TagT<139u,Fixpp::Type::Char>>>__Unparsed_>
            ((Unparsed *)
             (this->
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
             ).super_SmallVectorBase.BeginX,
             (Unparsed *)
             (this->
             super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
             ).super_SmallVectorBase.EndX,Dest);
  destroy_range((Unparsed *)
                (this->
                super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
                ).super_SmallVectorBase.BeginX,
                (Unparsed *)
                (this->
                super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
                ).super_SmallVectorBase.EndX);
  bVar3 = SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
          ::isSmall(&this->
                     super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
                   );
  if (!bVar3) {
    free((this->
         super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
         ).super_SmallVectorBase.BeginX);
  }
  SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
  ::setEnd(&this->
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
           ,Dest + ((long)pvVar1 - (long)pvVar2) / 0x18);
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
  ).super_SmallVectorBase.BeginX = Dest;
  (this->
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
  ).super_SmallVectorBase.CapacityX =
       (void *)((long)(this->
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>::Unparsed,_void>
                      ).super_SmallVectorBase.BeginX + (long)NewElts * 0x18);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}